

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O3

long __thiscall
glcts::anon_unknown_0::CNegativeUnalignedOffset<glcts::(anonymous_namespace)::test_api::GL>::Run
          (CNegativeUnalignedOffset<glcts::(anonymous_namespace)::test_api::GL> *this)

{
  CallLogWrapper *this_00;
  int iVar1;
  GLuint GVar2;
  GLenum GVar3;
  void *__s;
  long lVar4;
  long lVar5;
  DIResult result;
  string local_358;
  undefined1 local_338 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328 [23];
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [23];
  long local_38;
  
  anon_unknown_0::shaders::vshSimple<glcts::(anonymous_namespace)::test_api::GL>();
  local_338._0_8_ = local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,0x1aee929);
  anon_unknown_0::shaders::fshSimple<glcts::(anonymous_namespace)::test_api::GL>();
  GVar2 = DrawIndirectBase::CreateProgram
                    (&this->super_DrawIndirectBase,(string *)local_1b8,(string *)local_338,
                     &local_358,true);
  this->_program = GVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._0_8_ != local_328) {
    operator_delete((void *)local_338._0_8_,local_328[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1a8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_1b8._1_7_,local_1b8[0]),local_1a8[0]._M_allocated_capacity + 1
                   );
  }
  if (this->_program == 0) {
    lVar4 = -1;
  }
  else {
    this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
    ;
    glu::CallLogWrapper::glUseProgram(this_00,this->_program);
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->_vao);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->_vao);
    __s = operator_new(0x4000);
    memset(__s,0,0x4000);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_buffer);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->_buffer);
    glu::CallLogWrapper::glBufferData(this_00,0x8892,0x1000,__s,0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_bufferIndirect);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->_bufferIndirect);
    glu::CallLogWrapper::glBufferData(this_00,0x8f3f,0x1000,__s,0x88e4);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_ebo);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->_ebo);
    glu::CallLogWrapper::glBufferData(this_00,0x8893,0x1000,__s,0x88e4);
    local_1b8[0] = false;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b8 + 8));
    local_38 = 0;
    lVar5 = 0;
    do {
      iVar1 = *(int *)((long)&DAT_01add010 + lVar5);
      glu::CallLogWrapper::glDrawElementsIndirect(this_00,4,0x1405,(void *)(long)iVar1);
      GVar3 = glu::CallLogWrapper::glGetError(this_00);
      if (GVar3 != 0x501) {
        local_38 = -1;
        local_338._0_8_ = local_338._0_8_ & 0xffffffffffffff00;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_338 + 8));
        glcts::(anonymous_namespace)::DILogger::operator<<
                  ((DILogger *)local_338,
                   (char (*) [66])
                   "Invalid error code returned by a driver for GL_INVALID_VALUE type");
        DILogger::~DILogger((DILogger *)local_338);
      }
      glu::CallLogWrapper::glDrawArraysIndirect(this_00,4,(void *)(long)iVar1);
      GVar3 = glu::CallLogWrapper::glGetError(this_00);
      if (GVar3 != 0x501) {
        local_38 = -1;
        local_338._0_8_ = local_338._0_8_ & 0xffffffffffffff00;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_338 + 8));
        glcts::(anonymous_namespace)::DILogger::operator<<
                  ((DILogger *)local_338,
                   (char (*) [66])
                   "Invalid error code returned by a driver for GL_INVALID_VALUE type");
        DILogger::~DILogger((DILogger *)local_338);
      }
      lVar4 = local_38;
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0xc);
    DILogger::~DILogger((DILogger *)local_1b8);
    operator_delete(__s,0x4000);
  }
  return lVar4;
}

Assistant:

virtual long Run()
	{
		_program = CreateProgram(shaders::vshSimple<api>(), "", shaders::fshSimple<api>(), true);
		if (!_program)
		{
			return ERROR;
		}
		glUseProgram(_program);

		glGenVertexArrays(1, &_vao);
		glBindVertexArray(_vao);

		std::vector<GLuint> zarro(4096, 0);

		glGenBuffers(1, &_buffer);
		glBindBuffer(GL_ARRAY_BUFFER, _buffer);
		glBufferData(GL_ARRAY_BUFFER, 4096, &zarro[0], GL_STREAM_DRAW);
		glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, 0, 0);
		glEnableVertexAttribArray(0);

		glGenBuffers(1, &_bufferIndirect);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _bufferIndirect);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, 4096, &zarro[0], GL_STATIC_DRAW);

		glGenBuffers(1, &_ebo);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, _ebo);
		glBufferData(GL_ELEMENT_ARRAY_BUFFER, 4096, &zarro[0], GL_STATIC_DRAW);

		DIResult result;

		int offsets[] = { 1, 3, 1023 };
		for (size_t i = 0; i < sizeof(offsets) / sizeof(offsets[0]); i++)
		{
			glDrawElementsIndirect(GL_TRIANGLES, GL_UNSIGNED_INT, reinterpret_cast<void*>((deUintptr)offsets[i]));
			if (glGetError() != GL_INVALID_VALUE)
			{
				result.error() << "Invalid error code returned by a driver for GL_INVALID_VALUE type";
			}
			glDrawArraysIndirect(GL_TRIANGLES, reinterpret_cast<void*>((deUintptr)offsets[i]));
			if (glGetError() != GL_INVALID_VALUE)
			{
				result.error() << "Invalid error code returned by a driver for GL_INVALID_VALUE type";
			}
		}

		return result.code();
	}